

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O2

int Abc_NtkSopToAig(Abc_Ntk_t *pNtk)

{
  char *pSop;
  int iVar1;
  Hop_Man_t *p;
  Abc_Obj_t *pObj;
  Hop_Obj_t *pHVar2;
  int i;
  
  if (pNtk->ntkFunc != ABC_FUNC_SOP) {
    __assert_fail("Abc_NtkHasSop(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                  ,0x32f,"int Abc_NtkSopToAig(Abc_Ntk_t *)");
  }
  p = Hop_ManStart();
  iVar1 = Abc_NtkGetFaninMax(pNtk);
  i = 0;
  if (iVar1 != 0) {
    Hop_IthVar(p,iVar1 + -1);
    i = 0;
  }
  do {
    if (pNtk->vObjs->nSize <= i) {
      Mem_FlexStop((Mem_Flex_t *)pNtk->pManFunc,0);
      pNtk->pManFunc = p;
      pNtk->ntkFunc = ABC_FUNC_AIG;
      return 1;
    }
    pObj = Abc_NtkObj(pNtk,i);
    if (((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0xf) == 7)) &&
       (iVar1 = Abc_ObjIsBarBuf(pObj), iVar1 == 0)) {
      pSop = *(char **)&(pObj->field_5).iData;
      if (pSop == (char *)0x0) {
        __assert_fail("pNode->pData",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                      ,0x33e,"int Abc_NtkSopToAig(Abc_Ntk_t *)");
      }
      iVar1 = Abc_SopGetVarNum(pSop);
      if (iVar1 == 0) {
        pHVar2 = p->pConst1;
        iVar1 = Abc_SopIsConst0(pSop);
        pHVar2 = (Hop_Obj_t *)((long)iVar1 ^ (ulong)pHVar2);
      }
      else {
        iVar1 = Abc_SopGetVarNum(pSop);
        if (((iVar1 < 3) || (iVar1 = Abc_SopGetCubeNum(pSop), iVar1 < 2)) ||
           (iVar1 = Abc_SopIsExorType(pSop), iVar1 != 0)) {
          pHVar2 = Abc_ConvertSopToAigInternal(p,pSop);
        }
        else {
          pHVar2 = Dec_GraphFactorSop(p,pSop);
        }
      }
      (pObj->field_5).pData = pHVar2;
      if (pHVar2 == (Hop_Obj_t *)0x0) {
        Hop_ManStop(p);
        puts("Abc_NtkSopToAig: Error while converting SOP into AIG.");
        return 0;
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

int Abc_NtkSopToAig( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    Hop_Man_t * pMan;
    int i, Max;

    assert( Abc_NtkHasSop(pNtk) ); 

    // make dist1-free and SCC-free
//    Abc_NtkMakeLegit( pNtk );

    // start the functionality manager
    pMan = Hop_ManStart();
    Max = Abc_NtkGetFaninMax(pNtk);
    if ( Max ) Hop_IthVar( pMan, Max-1 );

    // convert each node from SOP to BDD
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( Abc_ObjIsBarBuf(pNode) )
            continue;
        assert( pNode->pData );
        pNode->pData = Abc_ConvertSopToAig( pMan, (char *)pNode->pData );
        if ( pNode->pData == NULL )
        {
            Hop_ManStop( pMan );
            printf( "Abc_NtkSopToAig: Error while converting SOP into AIG.\n" );
            return 0;
        }
    }
    Mem_FlexStop( (Mem_Flex_t *)pNtk->pManFunc, 0 );
    pNtk->pManFunc = pMan;

    // update the network type
    pNtk->ntkFunc = ABC_FUNC_AIG;
    return 1;
}